

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O2

void __thiscall tli_window_manager::TableBox::~TableBox(TableBox *this)

{
  ~TableBox(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TableBox::~TableBox() {
    for (const auto &row : table_) {
        for (auto &[box, pos] : row) {
            delete box;
        }
    }
}